

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCycled(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  undefined8 uVar1;
  uint uVar2;
  int *pInitState;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  ulong __size;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  Gia_ManCleanMark0(p);
  Gia_ManCycle(p,pCex,nFrames);
  uVar2 = p->nRegs;
  uVar7 = 0;
  iVar5 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar5 == 0) {
    pInitState = (int *)0x0;
  }
  else {
    pInitState = (int *)malloc((long)iVar5 << 2);
  }
  uVar6 = iVar5 * 0x20;
  for (; (int)uVar7 < (int)uVar2; uVar7 = uVar7 + 1) {
    pGVar3 = Gia_ManCi(p,(p->vCis->nSize - uVar2) + uVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(undefined8 *)pGVar3;
    if (uVar7 == uVar6) {
      uVar2 = uVar6 * 2;
      if ((int)uVar6 < 0x10) {
        uVar2 = 0x10;
      }
      if ((int)uVar6 < (int)uVar2) {
        iVar5 = ((uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1e) == 0);
        __size = (ulong)(uint)(iVar5 * 4);
        if (pInitState == (int *)0x0) {
          pInitState = (int *)malloc(__size);
        }
        else {
          pInitState = (int *)realloc(pInitState,__size);
        }
        if (pInitState == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
        }
        uVar6 = iVar5 * 0x20;
      }
    }
    uVar2 = 1 << ((byte)uVar7 & 0x1f);
    if (((uint)uVar1 >> 0x1e & 1) == 0) {
      pInitState[uVar7 >> 5] = pInitState[uVar7 >> 5] & ~uVar2;
    }
    else {
      pInitState[uVar7 >> 5] = pInitState[uVar7 >> 5] | uVar2;
    }
    uVar2 = p->nRegs;
  }
  pGVar4 = Gia_ManDupFlip(p,pInitState);
  free(pInitState);
  Gia_ManCleanMark0(p);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManDupCycled( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Man_t * pNew;
    Vec_Bit_t * vInits;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0(p);
    Gia_ManCycle( p, pCex, nFrames );
    vInits = Vec_BitAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        Vec_BitPush( vInits, pObj->fMark0 );
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInits) );
    Vec_BitFree( vInits );
    Gia_ManCleanMark0(p);
    return pNew;
}